

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t prk,
                    ptls_iovec_t info)

{
  ptls_hash_context_t *ppVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  uint8_t gen;
  uint8_t *local_90;
  size_t local_88;
  void *local_80;
  uint8_t digest [64];
  
  local_88 = prk.len;
  local_90 = prk.base;
  ppVar1 = (st_ptls_hash_context_t *)0x0;
  lVar4 = 0;
  local_80 = output;
  do {
    sVar3 = algo->digest_size;
    if (outlen <= sVar3 * lVar4) {
      if (ppVar1 != (st_ptls_hash_context_t *)0x0) {
        (*ppVar1->final)(ppVar1,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
        sVar3 = algo->digest_size;
      }
      (*ptls_clear_memory)(digest,sVar3);
      return 0;
    }
    if (ppVar1 == (st_ptls_hash_context_t *)0x0) {
      ppVar1 = ptls_hmac_create(algo,local_90,local_88);
      if (ppVar1 == (ptls_hash_context_t *)0x0) {
        return 0x201;
      }
    }
    else {
      (*ppVar1->update)(ppVar1,digest,sVar3);
    }
    (*ppVar1->update)(ppVar1,info.base,info.len);
    gen = (uint8_t)(lVar4 + 1);
    (*ppVar1->update)(ppVar1,&gen,1);
    (*ppVar1->final)(ppVar1,digest,PTLS_HASH_FINAL_MODE_RESET);
    lVar5 = lVar4 * algo->digest_size;
    uVar2 = algo->digest_size + lVar5;
    if (outlen <= uVar2) {
      uVar2 = outlen;
    }
    memcpy((void *)((long)local_80 + lVar5),digest,uVar2 - lVar5);
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t prk, ptls_iovec_t info)
{
    ptls_hash_context_t *hmac = NULL;
    size_t i;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];

    for (i = 0; (i * algo->digest_size) < outlen; ++i) {
        if (hmac == NULL) {
            if ((hmac = ptls_hmac_create(algo, prk.base, prk.len)) == NULL)
                return PTLS_ERROR_NO_MEMORY;
        } else {
            hmac->update(hmac, digest, algo->digest_size);
        }
        hmac->update(hmac, info.base, info.len);
        uint8_t gen = (uint8_t)(i + 1);
        hmac->update(hmac, &gen, 1);
        hmac->final(hmac, digest, 1);

        size_t off_start = i * algo->digest_size, off_end = off_start + algo->digest_size;
        if (off_end > outlen)
            off_end = outlen;
        memcpy((uint8_t *)output + off_start, digest, off_end - off_start);
    }

    if (hmac != NULL)
        hmac->final(hmac, NULL, PTLS_HASH_FINAL_MODE_FREE);

    ptls_clear_memory(digest, algo->digest_size);

    return 0;
}